

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

bool __thiscall
Clasp::SharedMinimizeData::imp
          (SharedMinimizeData *this,wsum_t *lhs,LevelWeight *w,wsum_t *rhs,uint32 *lev)

{
  size_type sVar1;
  long lVar2;
  byte bVar3;
  uint32 uVar4;
  uint uVar5;
  long lVar6;
  
  uVar4 = *lev;
  while ((uVar4 != (*(uint *)w & 0x7fffffff) && (lhs[uVar4] == rhs[uVar4]))) {
    uVar4 = uVar4 + 1;
    *lev = uVar4;
  }
  sVar1 = (this->adjust_).ebo_.size;
  do {
    uVar5 = uVar4;
    bVar3 = (byte)lev;
    if (sVar1 == uVar5) goto LAB_0014b33f;
    lev = (uint32 *)(ulong)uVar5;
    lVar6 = lhs[(long)lev];
    if (uVar5 == (*(uint *)w & 0x7fffffff)) {
      lVar6 = lVar6 + w->weight;
      w = w + (*(uint *)w >> 0x1f);
    }
    lVar2 = rhs[(long)lev];
    uVar4 = uVar5 + 1;
  } while (lVar6 == lVar2);
  bVar3 = lVar6 != lVar2 && lVar2 <= lVar6;
LAB_0014b33f:
  return (bool)(sVar1 != uVar5 & bVar3);
}

Assistant:

bool SharedMinimizeData::imp(wsum_t* lhs, const LevelWeight* w, const wsum_t* rhs, uint32& lev) const {
	assert(lev <= w->level && std::equal(lhs, lhs+lev, rhs));
	while (lev != w->level && lhs[lev] == rhs[lev]) { ++lev; }
	for (uint32 i = lev, end = numRules(); i != end; ++i) {
		wsum_t temp = lhs[i];
		if (i == w->level) { temp += w->weight; if (w->next) ++w; }
		if (temp != rhs[i]){ return temp > rhs[i]; }
	}
	return false;
}